

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattice.c
# Opt level: O1

void WebRtcIsac_NormLatticeFilterMa
               (int orderCoef,float *stateF,float *stateG,float *lat_in,double *filtcoeflo,
               double *lat_out)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ulong uVar4;
  long lVar5;
  undefined1 *puVar6;
  long lVar7;
  long lVar8;
  undefined1 *puVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float cth [12];
  float inv_cth [12];
  float sth [12];
  double a [13];
  float f [13] [40];
  float g [13] [40];
  float local_1178 [12];
  float afStack_1148 [12];
  float local_1118 [12];
  double local_10e8;
  undefined1 local_10e0 [104];
  float local_1078 [41];
  undefined1 local_fd4 [1916];
  float local_858 [41];
  undefined1 local_7b4 [1924];
  
  uVar10 = orderCoef + 1;
  lVar7 = 0;
  do {
    local_10e8 = 1.0;
    memcpy(local_10e0,filtcoeflo + lVar7 * (int)uVar10 + 1,(long)orderCoef * 8);
    WebRtcIsac_Dir2Lat(&local_10e8,orderCoef,local_1118,local_1178);
    fVar12 = (float)filtcoeflo[lVar7 * (int)uVar10];
    if (0 < orderCoef) {
      uVar4 = 0;
      do {
        fVar12 = fVar12 * local_1178[uVar4];
        afStack_1148[uVar4] = 1.0 / local_1178[uVar4];
        uVar4 = uVar4 + 1;
      } while ((uint)orderCoef != uVar4);
    }
    memcpy(local_1078,lat_in + lVar7 * 0x28,0xa0);
    memcpy(local_858,lat_in + lVar7 * 0x28,0xa0);
    if (0 < orderCoef) {
      lVar5 = 0x28;
      lVar8 = 0;
      do {
        fVar1 = *(float *)((long)local_1118 + lVar8);
        fVar2 = *(float *)((long)stateG + lVar8);
        fVar11 = (fVar1 * fVar2 + local_1118[lVar5]) * *(float *)((long)afStack_1148 + lVar8);
        local_1078[lVar5] = fVar11;
        local_858[lVar5] = fVar2 * *(float *)((long)local_1178 + lVar8) + fVar11 * fVar1;
        lVar8 = lVar8 + 4;
        lVar5 = lVar5 + 0x28;
      } while ((ulong)uVar10 * 4 + -4 != lVar8);
    }
    if (0 < orderCoef) {
      uVar4 = 0;
      puVar6 = local_fd4;
      puVar9 = local_7b4;
      do {
        fVar1 = afStack_1148[uVar4];
        fVar2 = local_1118[uVar4];
        fVar11 = local_1178[uVar4];
        uVar4 = uVar4 + 1;
        lVar5 = -0x27;
        do {
          fVar3 = *(float *)(puVar9 + lVar5 * 4 + -8);
          fVar13 = (fVar2 * fVar3 + *(float *)(puVar6 + lVar5 * 4 + -4)) * fVar1;
          *(float *)(puVar6 + lVar5 * 4 + 0x9c) = fVar13;
          *(float *)(puVar9 + lVar5 * 4 + 0x9c) = fVar3 * fVar11 + fVar13 * fVar2;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0);
        puVar9 = puVar9 + 0xa0;
        puVar6 = puVar6 + 0xa0;
      } while (uVar4 != (uint)orderCoef);
    }
    lVar5 = 0;
    do {
      lat_out[lVar5] = (double)(local_1078[(long)orderCoef * 0x28 + lVar5] * fVar12);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x28);
    if (-1 < orderCoef) {
      lVar5 = 0x27;
      uVar4 = 0;
      do {
        stateF[uVar4] = local_1078[lVar5];
        stateG[uVar4] = local_858[lVar5];
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x28;
      } while (uVar10 != uVar4);
    }
    lVar7 = lVar7 + 1;
    lat_out = lat_out + 0x28;
  } while (lVar7 != 6);
  return;
}

Assistant:

void WebRtcIsac_NormLatticeFilterMa(int orderCoef,
                                     float *stateF,
                                     float *stateG,
                                     float *lat_in,
                                     double *filtcoeflo,
                                     double *lat_out)
{
  int n,k,i,u,temp1;
  int ord_1 = orderCoef+1;
  float sth[MAX_AR_MODEL_ORDER];
  float cth[MAX_AR_MODEL_ORDER];
  float inv_cth[MAX_AR_MODEL_ORDER];
  double a[MAX_AR_MODEL_ORDER+1];
  float f[MAX_AR_MODEL_ORDER+1][HALF_SUBFRAMELEN], g[MAX_AR_MODEL_ORDER+1][HALF_SUBFRAMELEN];
  float gain1;

  for (u=0;u<SUBFRAMES;u++)
  {
    /* set the Direct Form coefficients */
    temp1 = u*ord_1;
    a[0] = 1;
    memcpy(a+1, filtcoeflo+temp1+1, sizeof(double) * (ord_1-1));

    /* compute lattice filter coefficients */
    WebRtcIsac_Dir2Lat(a,orderCoef,sth,cth);

    /* compute the gain */
    gain1 = (float)filtcoeflo[temp1];
    for (k=0;k<orderCoef;k++)
    {
      gain1 *= cth[k];
      inv_cth[k] = 1/cth[k];
    }

    /* normalized lattice filter */
    /*****************************/

    /* initial conditions */
    for (i=0;i<HALF_SUBFRAMELEN;i++)
    {
      f[0][i] = lat_in[i + u * HALF_SUBFRAMELEN];
      g[0][i] = lat_in[i + u * HALF_SUBFRAMELEN];
    }

    /* get the state of f&g for the first input, for all orders */
    for (i=1;i<ord_1;i++)
    {
      f[i][0] = inv_cth[i-1]*(f[i-1][0] + sth[i-1]*stateG[i-1]);
      g[i][0] = cth[i-1]*stateG[i-1] + sth[i-1]* f[i][0];
    }

    /* filtering */
    for(k=0;k<orderCoef;k++)
    {
      for(n=0;n<(HALF_SUBFRAMELEN-1);n++)
      {
        f[k+1][n+1] = inv_cth[k]*(f[k][n+1] + sth[k]*g[k][n]);
        g[k+1][n+1] = cth[k]*g[k][n] + sth[k]* f[k+1][n+1];
      }
    }

    for(n=0;n<HALF_SUBFRAMELEN;n++)
    {
      lat_out[n + u * HALF_SUBFRAMELEN] = gain1 * f[orderCoef][n];
    }

    /* save the states */
    for (i=0;i<ord_1;i++)
    {
      stateF[i] = f[i][HALF_SUBFRAMELEN-1];
      stateG[i] = g[i][HALF_SUBFRAMELEN-1];
    }
    /* process next frame */
  }

  return;
}